

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall
ImVector<ImGuiListClipperRange>::push_back
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  int *piVar1;
  int iVar2;
  ImGuiListClipperRange *pIVar3;
  ImS8 IVar4;
  ImS8 IVar5;
  undefined1 uVar6;
  ImGuiListClipperRange *pIVar7;
  int iVar8;
  int iVar9;
  
  iVar2 = this->Capacity;
  if (this->Size == iVar2) {
    iVar9 = this->Size + 1;
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar2 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar7 = (ImGuiListClipperRange *)
               (*GImAllocatorAllocFunc)((long)iVar9 * 0xc,GImAllocatorUserData);
      if (this->Data != (ImGuiListClipperRange *)0x0) {
        memcpy(pIVar7,this->Data,(long)this->Size * 0xc);
        pIVar3 = this->Data;
        if ((pIVar3 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      this->Data = pIVar7;
      this->Capacity = iVar9;
    }
  }
  pIVar7 = this->Data;
  iVar2 = this->Size;
  IVar4 = v->PosToIndexOffsetMin;
  IVar5 = v->PosToIndexOffsetMax;
  uVar6 = v->field_0xb;
  pIVar3 = pIVar7 + iVar2;
  pIVar3->PosToIndexConvert = v->PosToIndexConvert;
  pIVar3->PosToIndexOffsetMin = IVar4;
  pIVar3->PosToIndexOffsetMax = IVar5;
  pIVar3->field_0xb = uVar6;
  iVar9 = v->Max;
  pIVar7 = pIVar7 + iVar2;
  pIVar7->Min = v->Min;
  pIVar7->Max = iVar9;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }